

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O1

void __thiscall
mir::inst::LoadOffsetInst::LoadOffsetInst(LoadOffsetInst *this,Value *src,VarId *dest,Value *offset)

{
  uint32_t uVar1;
  uint8_t uVar2;
  anon_class_8_1_a78179b7_conflict local_38;
  
  uVar1 = dest->id;
  (this->super_Inst).dest.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
  (this->super_Inst).dest.id = uVar1;
  (this->super_Inst).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001f0258;
  local_38.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&(this->src).field_0x8;
  (this->src).field_0x18 = 0xff;
  (this->src).field_0x18 = src->field_0x18;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)(char)src->field_0x18 + 1]._M_data)
            (&local_38,(variant<int,_mir::inst::VarId> *)&src->field_0x8);
  (this->src).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001effc8;
  uVar2 = src->shift_amount;
  (this->src).shift = src->shift;
  (this->src).shift_amount = uVar2;
  local_38.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&(this->offset).field_0x8;
  (this->offset).field_0x18 = 0xff;
  (this->offset).field_0x18 = offset->field_0x18;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)(char)offset->field_0x18 + 1]._M_data)
            (&local_38,(variant<int,_mir::inst::VarId> *)&offset->field_0x8);
  (this->offset).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001effc8;
  uVar2 = offset->shift_amount;
  (this->offset).shift = offset->shift;
  (this->offset).shift_amount = uVar2;
  return;
}

Assistant:

LoadOffsetInst(Value src, VarId dest, Value offset = 0)
      : src(src), Inst(dest), offset(offset) {}